

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::StringOutputStream::Next(StringOutputStream *this,void **data,int *size)

{
  LogMessage *pLVar1;
  ulong uVar2;
  string *psVar3;
  int iVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  psVar3 = this->target_;
  if (psVar3 == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x8e);
    pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: target_ != NULL: ");
    internal::LogFinisher::operator=(&local_61,pLVar1);
    internal::LogMessage::~LogMessage(&local_60);
    psVar3 = this->target_;
  }
  iVar4 = (int)psVar3->_M_string_length;
  uVar2 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(psVar3->_M_dataplus)._M_p != &psVar3->field_2) {
    uVar2 = (psVar3->field_2)._M_allocated_capacity;
  }
  if (uVar2 <= (ulong)(long)iVar4) {
    if (0x3fffffff < iVar4) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                 ,0x9b);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_60,"Cannot allocate buffer larger than kint32max for ");
      pLVar1 = internal::LogMessage::operator<<(pLVar1,"StringOutputStream.");
      internal::LogFinisher::operator=(&local_61,pLVar1);
      internal::LogMessage::~LogMessage(&local_60);
      return false;
    }
    uVar2 = 0x10;
    if (0x10 < iVar4 * 2) {
      uVar2 = (ulong)(uint)(iVar4 * 2);
    }
  }
  std::__cxx11::string::resize((ulong)psVar3,(char)uVar2);
  *data = (this->target_->_M_dataplus)._M_p + iVar4;
  *size = (int)this->target_->_M_string_length - iVar4;
  return true;
}

Assistant:

bool StringOutputStream::Next(void** data, int* size) {
  GOOGLE_CHECK(target_ != NULL);
  int old_size = target_->size();

  // Grow the string.
  if (old_size < target_->capacity()) {
    // Resize the string to match its capacity, since we can get away
    // without a memory allocation this way.
    STLStringResizeUninitialized(target_, target_->capacity());
  } else {
    // Size has reached capacity, try to double the size.
    if (old_size > std::numeric_limits<int>::max() / 2) {
      // Can not double the size otherwise it is going to cause integer
      // overflow in the expression below: old_size * 2 ";
      GOOGLE_LOG(ERROR) << "Cannot allocate buffer larger than kint32max for "
                 << "StringOutputStream.";
      return false;
    }
    // Double the size, also make sure that the new size is at least
    // kMinimumSize.
    STLStringResizeUninitialized(
        target_,
        std::max(old_size * 2,
                 kMinimumSize + 0));  // "+ 0" works around GCC4 weirdness.
  }

  *data = mutable_string_data(target_) + old_size;
  *size = target_->size() - old_size;
  return true;
}